

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.cpp
# Opt level: O2

void __thiscall
OpenNN::NeuralNetwork::train(NeuralNetwork *this,int epochs,MatrixXd *inputs,MatrixXd *targets)

{
  vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>_*,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_*>_>
  *this_00;
  long lVar1;
  Layer *pLVar2;
  DenseStorage<double,__1,__1,__1,_0> *pDVar3;
  reference ppMVar4;
  ostream *poVar5;
  int iVar6;
  int iVar7;
  size_type __n;
  long i;
  MatrixXd current_weights;
  MatrixXd delta_weights_transposed;
  MatrixXd teste;
  MatrixXd target;
  MatrixXd gradients;
  DenseStorage<double,__1,__1,__1,_0> local_128;
  MatrixXd current_values;
  MatrixXd error;
  MatrixXd input;
  MatrixXd delta_weights;
  DenseStorage<double,__1,__1,__1,_0> local_b0;
  DenseStorage<double,__1,__1,__1,_0> local_98;
  MatrixXd output;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
  local_48;
  
  if (((epochs != 0) &&
      (lVar1 = (inputs->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
               m_rows,
      (inputs->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols *
      lVar1 != 0)) &&
     ((targets->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols *
      (targets->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows
      != 0)) {
    iVar6 = 0;
    if (epochs < 1) {
      epochs = 0;
    }
    this_00 = &this->weight_matrices;
    for (; iVar6 != epochs; iVar6 = iVar6 + 1) {
      for (i = 0; i < lVar1; i = i + 1) {
        Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>::Block
                  ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> *)&output,inputs,i
                  );
        Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
        PlainObjectBase<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,1,_1,false>>
                  ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&input,
                   (DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>
                    *)&output);
        Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>::Block
                  ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> *)&output,targets,
                   i);
        Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
        PlainObjectBase<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,1,_1,false>>
                  ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&target,
                   (DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>
                    *)&output);
        Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage
                  (&local_98,(DenseStorage<double,__1,__1,__1,_0> *)&input);
        predict(&output,this,(MatrixXd *)&local_98);
        free(local_98.m_data);
        Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator-
                  ((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                    *)&current_values,(MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&output,
                   (MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&target);
        Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
        PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::Matrix<double,_1,_1,0,_1,_1>const>>
                  ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&error,
                   (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                    *)&current_values);
        Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage
                  (&local_128,(DenseStorage<double,__1,__1,__1,_0> *)&output);
        Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage
                  (&local_b0,(DenseStorage<double,__1,__1,__1,_0> *)&target);
        calculate_error(this,(MatrixXd *)&local_128,(MatrixXd *)&local_b0);
        free(local_b0.m_data);
        free(local_128.m_data);
        iVar7 = (int)((ulong)((long)(this->network_layers).
                                    super__Vector_base<OpenNN::Layer_*,_std::allocator<OpenNN::Layer_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->network_layers).
                                   super__Vector_base<OpenNN::Layer_*,_std::allocator<OpenNN::Layer_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 3);
        pLVar2 = get_layer(this,iVar7 + -1);
        pDVar3 = (DenseStorage<double,__1,__1,__1,_0> *)Layer::to_matrix_derivated(pLVar2);
        Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage
                  ((DenseStorage<double,__1,__1,__1,_0> *)&current_values,pDVar3);
        Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
        cwiseProduct<Eigen::Matrix<double,_1,_1,0,_1,_1>>
                  ((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                    *)&teste,(MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&error,
                   (MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&current_values);
        Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
        PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::Matrix<double,_1,_1,0,_1,_1>const>>
                  ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&gradients,
                   (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                    *)&teste);
        iVar7 = iVar7 + -2;
        pLVar2 = get_layer(this,iVar7);
        pDVar3 = (DenseStorage<double,__1,__1,__1,_0> *)Layer::to_matrix_activated(pLVar2);
        Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage
                  ((DenseStorage<double,__1,__1,__1,_0> *)&teste,pDVar3);
        current_weights.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
        m_data = (double *)&gradients;
        delta_weights_transposed.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
        m_storage._0_16_ =
             Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,-1,-1,0,-1,-1>>>::operator*
                       ((MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>> *)
                        &current_weights,
                        (MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&teste);
        Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
        PlainObjectBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>>
                  ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&delta_weights,
                   (DenseBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>
                    *)&delta_weights_transposed);
        current_weights.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
        m_data = (double *)&delta_weights;
        Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
        PlainObjectBase<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>>
                  ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&delta_weights_transposed
                   ,(DenseBase<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)
                    &current_weights);
        __n = (size_type)iVar7;
        ppMVar4 = std::
                  vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_*,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_*>_>
                  ::at(this_00,__n);
        Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage
                  ((DenseStorage<double,__1,__1,__1,_0> *)&current_weights,
                   (DenseStorage<double,__1,__1,__1,_0> *)*ppMVar4);
        Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator-
                  (&local_48,(MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&current_weights,
                   (MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                   &delta_weights_transposed);
        ppMVar4 = std::
                  vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_*,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_*>_>
                  ::at(this_00,__n);
        Eigen::internal::
        call_assignment<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::Matrix<double,_1,_1,0,_1,_1>const>>
                  (*ppMVar4,&local_48);
        poVar5 = std::operator<<((ostream *)&std::cout,"Current Weights: ");
        poVar5 = std::endl<char,std::char_traits<char>>(poVar5);
        poVar5 = Eigen::operator<<(poVar5,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                                          &current_weights);
        std::endl<char,std::char_traits<char>>(poVar5);
        poVar5 = std::operator<<((ostream *)&std::cout,"Delta Weights: ");
        poVar5 = std::endl<char,std::char_traits<char>>(poVar5);
        poVar5 = Eigen::operator<<(poVar5,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                                          &delta_weights_transposed);
        std::endl<char,std::char_traits<char>>(poVar5);
        poVar5 = std::operator<<((ostream *)&std::cout,"Updated Weights: ");
        poVar5 = std::endl<char,std::char_traits<char>>(poVar5);
        ppMVar4 = std::
                  vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_*,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_*>_>
                  ::at(this_00,__n);
        poVar5 = Eigen::operator<<(poVar5,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                                          *ppMVar4);
        std::endl<char,std::char_traits<char>>(poVar5);
        poVar5 = std::operator<<((ostream *)&std::cout,"=====================================");
        poVar5 = std::endl<char,std::char_traits<char>>(poVar5);
        std::endl<char,std::char_traits<char>>(poVar5);
        free(current_weights.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
             m_storage.m_data);
        free(delta_weights_transposed.
             super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
        free(delta_weights.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
             m_storage.m_data);
        free(teste.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
            );
        free(gradients.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
             m_data);
        free(current_values.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
             m_storage.m_data);
        free(error.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
            );
        free(output.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
             m_data);
        free(target.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
             m_data);
        free(input.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
            );
        lVar1 = (inputs->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage
                .m_rows;
      }
    }
    return;
  }
  poVar5 = std::operator<<((ostream *)&std::cerr,"Missing train data!");
  std::endl<char,std::char_traits<char>>(poVar5);
  __assert_fail("false",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/M4urici0GM[P]Perceptron/src/NeuralNetwork/NeuralNetwork.cpp"
                ,0x5c,"void OpenNN::NeuralNetwork::train(int, Eigen::MatrixXd, Eigen::MatrixXd)");
}

Assistant:

void OpenNN::NeuralNetwork::train(int epochs, Eigen::MatrixXd inputs, Eigen::MatrixXd targets)
{
    if (epochs == 0 || inputs.size() == 0 || targets.size() == 0)
    {
        std::cerr << "Missing train data!" << std::endl;
        assert(false);
    }

    for (int epoch = 0; epoch < epochs; epoch++)
    {
        for (int i = 0; i < inputs.rows(); i++)
        {
            Eigen::MatrixXd input = inputs.row(i).matrix();
            Eigen::MatrixXd target = targets.row(i).matrix();

            Eigen::MatrixXd output = this->predict(input);

            Eigen::MatrixXd error = (output - target);

            this->calculate_error(output, target);

            int output_layer_index = (this->network_layers.size() - 1);
            int first_hidden_layer_index = (output_layer_index - 1);

            /**
             * Output to the firt hidden
             * ----------------------------------
             * */
            Layer* current_layer = this->get_layer(output_layer_index);
            Eigen::MatrixXd current_values = *current_layer->to_matrix_derivated();

            //Calculate the gradient of current layer
            Eigen::MatrixXd gradients = error.cwiseProduct(current_values);
            // gradients *= this->learning_rate;

            /**
             * Multiply the transposed version of the gradient matrix by the output of the previous layer 
             * and transpose it
             * */
            auto teste = *this->get_layer(first_hidden_layer_index)->to_matrix_activated();
            

            Eigen::MatrixXd delta_weights = gradients.transpose() * teste;
            Eigen::MatrixXd delta_weights_transposed = delta_weights.transpose();

            /**
             * Get the weights between the previous layer and the current one
             * */
            Eigen::MatrixXd current_weights = *this->weight_matrices.at(first_hidden_layer_index);

            /**
             * Subtract the current weights by the delta weight
             * */


            /**
             * Update the weights with the new one
             * */
            *this->weight_matrices.at(first_hidden_layer_index) = (current_weights - delta_weights_transposed);


            std::cout << "Current Weights: " << std::endl << current_weights << std::endl;
            std::cout << "Delta Weights: " << std::endl << delta_weights_transposed << std::endl;
            std::cout << "Updated Weights: " << std::endl << *this->weight_matrices.at(first_hidden_layer_index) << std::endl;
            std::cout << "=====================================" << std::endl << std::endl;
        }   
    }
}